

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O1

void tp_join(thread_pool_t *tp)

{
  int iVar1;
  long lVar2;
  
  if (((tp != (thread_pool_t *)0x0) && (tp->threads != (pthread_t *)0x0)) && (0 < (int)tp->nthread))
  {
    lVar2 = 0;
    do {
      iVar1 = pthread_join(tp->threads[lVar2],(void **)0x0);
      if (iVar1 != 0) {
        perror("pthread_join() failed");
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (int)tp->nthread);
  }
  return;
}

Assistant:

void tp_join(thread_pool_t *tp)
{
    int i;

    if (tp && tp->threads) {
        for (i = 0; i < (int) tp->nthread; ++i) {
            // todo: check return value
            if (pthread_join(tp->threads[i], NULL)) {
                perror("pthread_join() failed");
            }
        }
    }
}